

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_selection_ivec2(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_2> local_50;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  Functional local_20 [8];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)local_10 + 0x40,1);
  tcu::Vector<float,_2>::asInt((Vector<float,_2> *)(local_30 + 8));
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)local_10 + 0x50,2);
  tcu::Vector<float,_2>::asInt((Vector<float,_2> *)(local_40 + 8));
  selection<tcu::Vector<int,2>>
            (local_20,0.0 < fVar1,(Vector<int,_2> *)(local_30 + 8),(Vector<int,_2> *)(local_40 + 8))
  ;
  tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_18);
  local_50 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_50,&local_18);
  return;
}

Assistant:

void eval_selection_ivec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asInt(),			c.in[2].swizzle(2, 1).asInt()).asFloat(); }